

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxRuntime.cpp
# Opt level: O3

ScriptPtr __thiscall
Jinx::Impl::Runtime::CreateScript(Runtime *this,BufferPtr *bytecode,Any *userContext)

{
  element_type *peVar1;
  any *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  ScriptPtr SVar3;
  undefined1 local_49;
  shared_ptr<Jinx::Buffer> local_48;
  _func_int **local_38;
  element_type *peStack_30;
  shared_ptr<Jinx::Impl::Runtime> local_28;
  
  std::__shared_ptr<Jinx::Impl::Runtime,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<Jinx::Impl::Runtime,void>
            ((__shared_ptr<Jinx::Impl::Runtime,(__gnu_cxx::_Lock_policy)2> *)&local_28,
             (__weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2> *)
             &(bytecode->super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_refcount);
  local_48.super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)userContext->_M_manager;
  local_48.super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(userContext->_M_storage)._M_ptr;
  if (local_48.super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_48.super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_48.super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_48.super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_48.super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  std::__shared_ptr<Jinx::Impl::Script,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<Jinx::Allocator<Jinx::Impl::Script>,std::shared_ptr<Jinx::Impl::Runtime>,std::shared_ptr<Jinx::Buffer>,std::any&>
            ((__shared_ptr<Jinx::Impl::Script,(__gnu_cxx::_Lock_policy)2> *)&local_38,
             (Allocator<Jinx::Impl::Script> *)&local_49,&local_28,&local_48,in_RCX);
  peVar1 = peStack_30;
  peStack_30 = (element_type *)0x0;
  (this->super_IRuntime)._vptr_IRuntime = local_38;
  (this->super_enable_shared_from_this<Jinx::Impl::Runtime>)._M_weak_this.
  super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  local_38 = (_func_int **)0x0;
  _Var2._M_pi = extraout_RDX;
  if (local_48.super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
    _Var2._M_pi = extraout_RDX_00;
  }
  if (local_28.super___shared_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.super___shared_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var2._M_pi = extraout_RDX_01;
  }
  SVar3.super___shared_ptr<Jinx::IScript,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  SVar3.super___shared_ptr<Jinx::IScript,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ScriptPtr)SVar3.super___shared_ptr<Jinx::IScript,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline_t ScriptPtr Runtime::CreateScript(BufferPtr bytecode, Any userContext)
	{
		return std::allocate_shared<Script>(Allocator<Script>(), shared_from_this(), std::static_pointer_cast<Buffer>(bytecode), userContext);
	}